

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextOptimizationOverrideInfo.cpp
# Opt level: O0

void __thiscall
Js::ScriptContextOptimizationOverrideInfo::Merge
          (ScriptContextOptimizationOverrideInfo *this,ScriptContextOptimizationOverrideInfo *info)

{
  ScriptContextOptimizationOverrideInfo *pSVar1;
  ScriptContextOptimizationOverrideInfo *local_28;
  ScriptContextOptimizationOverrideInfo *infoRoot;
  ScriptContextOptimizationOverrideInfo *thisRoot;
  ScriptContextOptimizationOverrideInfo *info_local;
  ScriptContextOptimizationOverrideInfo *this_local;
  
  infoRoot = this->crossSiteRoot;
  pSVar1 = info->crossSiteRoot;
  if (infoRoot == pSVar1) {
    if (infoRoot != (ScriptContextOptimizationOverrideInfo *)0x0) {
      return;
    }
    Update(this,info);
    this->crossSiteRoot = this;
    this->crossSitePrev = this;
    this->crossSiteNext = this;
    Insert(this,info);
  }
  else {
    local_28 = pSVar1;
    thisRoot = info;
    if (infoRoot == (ScriptContextOptimizationOverrideInfo *)0x0) {
      local_28 = (ScriptContextOptimizationOverrideInfo *)0x0;
      infoRoot = pSVar1;
      thisRoot = this;
    }
    Update(infoRoot,thisRoot);
    ForEachCrossSiteInfo<Js::ScriptContextOptimizationOverrideInfo::Merge(Js::ScriptContextOptimizationOverrideInfo*)::__0>
              (infoRoot,(anon_class_8_1_3124ea1e)infoRoot);
    if (local_28 == (ScriptContextOptimizationOverrideInfo *)0x0) {
      Insert(infoRoot,thisRoot);
    }
    else {
      ForEachEditingCrossSiteInfo<Js::ScriptContextOptimizationOverrideInfo::Merge(Js::ScriptContextOptimizationOverrideInfo*)::__1>
                (thisRoot,(anon_class_8_1_3124ea1e)infoRoot);
    }
  }
  Verify(this);
  return;
}

Assistant:

void
ScriptContextOptimizationOverrideInfo::Merge(ScriptContextOptimizationOverrideInfo * info)
{
    ScriptContextOptimizationOverrideInfo * thisRoot = this->crossSiteRoot;
    ScriptContextOptimizationOverrideInfo * infoRoot = info->crossSiteRoot;
    if (thisRoot == infoRoot)
    {
        if (thisRoot != nullptr)
        {
            // Both info is already in the same info group
            return;
        }

        // Both of them are null, just group them

        // Update this to be the template
        this->Update(info);

        // Initialize the cross site list
        this->crossSiteRoot = this;
        this->crossSitePrev = this;
        this->crossSiteNext = this;

        // Insert the info to the list
        this->Insert(info);
    }
    else
    {
        if (thisRoot == nullptr)
        {
            thisRoot = infoRoot;
            infoRoot = nullptr;
            info = this;
        }

        thisRoot->Update(info);

        // Spread the information on the current group
        thisRoot->ForEachCrossSiteInfo([thisRoot](ScriptContextOptimizationOverrideInfo * i)
        {
            thisRoot->CopyTo(i);
        });

        if (infoRoot == nullptr)
        {
            thisRoot->Insert(info);
        }
        else
        {
            // Insert the other group
            info->ForEachEditingCrossSiteInfo([thisRoot](ScriptContextOptimizationOverrideInfo * i)
            {
                thisRoot->Insert(i);
            });
        }
    }

    DebugOnly(Verify());
}